

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_visitor.h
# Opt level: O3

void __thiscall
google::protobuf::internal::
VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/compiler/command_line_interface.cc:1276:16)>_>
::Visit<>(VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O3__deps_protobuf_src_src_google_protobuf_compiler_command_line_interface_cc:1276:16)>_>
          *this,Descriptor *descriptor)

{
  long lVar1;
  long lVar2;
  
  if (0 < *(int *)(descriptor + 4)) {
    lVar2 = 0;
    lVar1 = 0;
    do {
      Visit<>(this,(FieldDescriptor *)(*(long *)(descriptor + 0x38) + lVar2));
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 0x58;
    } while (lVar1 < *(int *)(descriptor + 4));
  }
  if (0 < *(int *)(descriptor + 0x80)) {
    lVar2 = 0;
    lVar1 = 0;
    do {
      Visit<>(this,(Descriptor *)(*(long *)(descriptor + 0x48) + lVar2));
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 0x98;
    } while (lVar1 < *(int *)(descriptor + 0x80));
  }
  if (0 < *(int *)(descriptor + 0x8c)) {
    lVar2 = 0;
    lVar1 = 0;
    do {
      Visit<>(this,(FieldDescriptor *)(*(long *)(descriptor + 0x60) + lVar2));
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 0x58;
    } while (lVar1 < *(int *)(descriptor + 0x8c));
  }
  return;
}

Assistant:

void Visit(const Descriptor& descriptor, Proto&... proto) {
    visitor(descriptor, proto...);

    for (int i = 0; i < descriptor.enum_type_count(); i++) {
      Visit(*descriptor.enum_type(i), enum_type(proto, i)...);
    }

    for (int i = 0; i < descriptor.oneof_decl_count(); i++) {
      Visit(*descriptor.oneof_decl(i), oneof_decl(proto, i)...);
    }

    for (int i = 0; i < descriptor.field_count(); i++) {
      Visit(*descriptor.field(i), field(proto, i)...);
    }

    for (int i = 0; i < descriptor.nested_type_count(); i++) {
      Visit(*descriptor.nested_type(i), nested_type(proto, i)...);
    }

    for (int i = 0; i < descriptor.extension_count(); i++) {
      Visit(*descriptor.extension(i), extension(proto, i)...);
    }

    for (int i = 0; i < descriptor.extension_range_count(); i++) {
      Visit(*descriptor.extension_range(i), extension_range(proto, i)...);
    }
  }